

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall gl4cts::EnhancedLayouts::Utils::Buffer::~Buffer(Buffer *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (this->m_id != 0xffffffff) {
    iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,this);
    this->m_id = 0xffffffff;
  }
  return;
}

Assistant:

void Buffer::Release()
{
	if (m_invalid_id != m_id)
	{
		const Functions& gl = m_context.getRenderContext().getFunctions();

		gl.deleteBuffers(1, &m_id);
		m_id = m_invalid_id;
	}
}